

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

optional<long_long> __thiscall QHttpHeaders::intValue(QHttpHeaders *this,QAnyStringView name)

{
  QHttpHeadersPrivate *this_00;
  _Storage<long_long,_true> extraout_RAX;
  QByteArrayView *this_01;
  _Storage<long_long,_true> _Var1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  long in_FS_OFFSET;
  optional<long_long> oVar3;
  _Storage<QByteArrayView,_true> local_58;
  undefined1 *local_48;
  bool ok;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._M_value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58._M_value.m_data = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (this->d).d.ptr;
  HeaderName::HeaderName((HeaderName *)&ok,name);
  QHttpHeadersPrivate::findValue
            ((optional<QByteArrayView> *)&local_58._M_value,this_00,(HeaderName *)&ok);
  std::__detail::__variant::_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray>::
  _M_reset((_Variant_storage<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)&ok);
  if ((char)local_48 == '\x01') {
    ok = false;
    this_01 = std::
              _Optional_base_impl<QByteArrayView,_std::_Optional_base<QByteArrayView,_true,_true>_>
              ::_M_get((_Optional_base_impl<QByteArrayView,_std::_Optional_base<QByteArrayView,_true,_true>_>
                        *)&local_58._M_value);
    _Var1._M_value = QByteArrayView::toLongLong(this_01,&ok,10);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),ok);
  }
  else {
    uVar2 = 0;
    _Var1 = extraout_RAX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._8_8_ = uVar2;
    oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._M_payload._M_value = _Var1._M_value;
    return (optional<long_long>)
           oVar3.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>;
  }
  __stack_chk_fail();
}

Assistant:

const noexcept
{
    std::optional<QByteArrayView> v = d->findValue(HeaderName{name});
    if (!v)
        return std::nullopt;
    bool ok = false;
    const qint64 result = v->toLongLong(&ok);
    if (ok)
        return result;
    return std::nullopt;
}